

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread.c
# Opt level: O3

void getaddrinfo_do(getaddrinfo_req *req)

{
  int *piVar1;
  uv_buf_t *puVar2;
  int iVar3;
  addrinfo *ai;
  undefined1 *puVar4;
  uv_fs_t *req_00;
  int64_t eval_b;
  int64_t eval_a;
  void *pvStack_40;
  void *pvStack_28;
  code *pcStack_20;
  void *local_10;
  void *local_8;
  
  pcStack_20 = (code *)0x1cfae2;
  iVar3 = uv_getaddrinfo(req->loop,&req->handle,getaddrinfo_cb,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  local_8 = (void *)(long)iVar3;
  local_10 = (void *)0x0;
  if (local_8 == (void *)0x0) {
    return;
  }
  puVar4 = (undefined1 *)&stack0xfffffffffffffff8;
  pcStack_20 = fs_do;
  getaddrinfo_do_cold_1();
  iVar3 = uv_fs_stat(*(uv_loop_t **)(puVar4 + 0x10),(uv_fs_t *)(puVar4 + 0x18),".",fs_cb);
  pcStack_20 = (code *)(long)iVar3;
  pvStack_28 = (void *)0x0;
  if (pcStack_20 == (code *)0x0) {
    return;
  }
  puVar4 = (undefined1 *)&stack0xffffffffffffffe0;
  iVar3 = (int)&stack0xffffffffffffffd8;
  fs_do_cold_1();
  pvStack_40 = (void *)(long)iVar3;
  if (pvStack_40 != (void *)0x0) {
    req_00 = (uv_fs_t *)&stack0xffffffffffffffc0;
    getaddrinfo_cb_cold_1();
    uv_fs_req_cleanup(req_00);
    puVar2 = req_00[-1].bufsml + 3;
    *(int *)&puVar2->base = *(int *)&puVar2->base + -1;
    if (*(int *)&puVar2->base != 0) {
      fs_do((fs_req *)&req_00[-1].bufsml[2].len);
      return;
    }
    return;
  }
  uv_freeaddrinfo(ai);
  piVar1 = (int *)(puVar4 + -0x10);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    getaddrinfo_do((getaddrinfo_req *)(puVar4 + -0x18));
    return;
  }
  return;
}

Assistant:

static void getaddrinfo_do(struct getaddrinfo_req* req) {
  int r;

  r = uv_getaddrinfo(req->loop,
                     &req->handle,
                     getaddrinfo_cb,
                     "localhost",
                     NULL,
                     NULL);
  ASSERT_OK(r);
}